

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_cylinders.cc
# Opt level: O0

string * concat<char_const(&)[16],unsigned_int,char_const(&)[5]>
                   (string *__return_storage_ptr__,char (*args) [16],uint *args_1,char (*args_2) [5]
                   )

{
  ostream *poVar1;
  ostringstream local_1a0 [8];
  ostringstream ss;
  char (*args_local_2) [5];
  uint *args_local_1;
  char (*args_local) [16];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,*args);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*args_1);
  std::operator<<(poVar1,*args_2);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string concat(Args &&...args) {
  std::ostringstream ss;  // NOLINT(misc-const-correctness)
  (ss << ... << args);
  return ss.str();
}